

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void __thiscall tvm::runtime::WorkspacePool::Pool::Pool(Pool *this)

{
  undefined1 local_20 [8];
  Entry e;
  Pool *this_local;
  
  e.size = (size_t)this;
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::vector(&this->free_list_);
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::vector(&this->allocated_);
  local_20 = (undefined1  [8])0x0;
  e.data = (void *)0x0;
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->free_list_,(value_type *)local_20);
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->allocated_,(value_type *)local_20);
  return;
}

Assistant:

Pool() {
    // safe guard header on each list.
    Entry e;
    e.data = nullptr;
    e.size = 0;
    free_list_.push_back(e);
    allocated_.push_back(e);
  }